

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_2014f3::LineEdit::focusInEvent(LineEdit *this,QFocusEvent *e)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QLineEdit::text();
  pDVar2 = (this->origText).d.d;
  pcVar3 = (this->origText).d.ptr;
  (this->origText).d.d = local_38.d;
  (this->origText).d.ptr = local_38.ptr;
  qVar1 = (this->origText).d.size;
  (this->origText).d.size = local_38.size;
  local_38.d = pDVar2;
  local_38.ptr = pcVar3;
  local_38.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  QLineEdit::focusInEvent((QFocusEvent *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void focusInEvent(QFocusEvent *e) override
    {
        origText = text();
        QLineEdit::focusInEvent(e);
    }